

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLimiter.cpp
# Opt level: O3

ostream * operator<<(ostream *os,Code code)

{
  size_t sVar1;
  char *pcVar2;
  char *__s;
  
  pcVar2 = "Unknown code";
  if (code == TooManyRequests) {
    pcVar2 = "Too many requests (429)";
  }
  __s = "Ok (200)";
  if (code != Ok) {
    __s = pcVar2;
  }
  sVar1 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, HttpResult::Code code)
{
    const auto str =
        code == HttpResult::Code::Ok ? "Ok (200)" :
        code == HttpResult::Code::TooManyRequests ? "Too many requests (429)" :
        "Unknown code";
    os << str;
    return os;
}